

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recycler.cpp
# Opt level: O2

void __thiscall
Memory::Recycler::SetCollectionWrapper(Recycler *this,RecyclerCollectionWrapper *wrapper)

{
  uint uVar1;
  
  this->collectionWrapper = wrapper;
  uVar1 = (*wrapper->_vptr_RecyclerCollectionWrapper[10])(wrapper);
  this->Cookie = uVar1;
  return;
}

Assistant:

void
Recycler::SetCollectionWrapper(RecyclerCollectionWrapper * wrapper)
{
    this->collectionWrapper = wrapper;
#if LARGEHEAPBLOCK_ENCODING
    this->Cookie = wrapper->GetRandomNumber();
#else
    this->Cookie = 0;
#endif
}